

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQBool __thiscall RefTable::Release(RefTable *this,SQObject *obj)

{
  RefNode *o_00;
  SQUnsignedInteger SVar1;
  long in_RDI;
  SQObjectPtr o;
  RefNode *ref;
  RefNode *prev;
  SQHash mainpos;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  RefNode **in_stack_ffffffffffffffb8;
  SQHash *in_stack_ffffffffffffffc0;
  SQObjectValue in_stack_ffffffffffffffc8;
  RefTable *in_stack_ffffffffffffffd0;
  long local_28;
  long local_20;
  SQBool local_8;
  
  o_00 = Get(in_stack_ffffffffffffffd0,(SQObject *)in_stack_ffffffffffffffc8.pTable,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
  if ((o_00 == (RefNode *)0x0) || (SVar1 = o_00->refs - 1, o_00->refs = SVar1, SVar1 != 0)) {
    local_8 = 0;
  }
  else {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc0,&o_00->obj);
    if (local_28 == 0) {
      *(RefNode **)(*(long *)(in_RDI + 0x20) + local_20 * 8) = o_00->next;
    }
    else {
      *(RefNode **)(local_28 + 0x18) = o_00->next;
    }
    o_00->next = *(RefNode **)(in_RDI + 0x18);
    *(RefNode **)(in_RDI + 0x18) = o_00;
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -1;
    ::SQObjectPtr::Null((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
                       );
    local_8 = 1;
    ::SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  }
  return local_8;
}

Assistant:

SQBool RefTable::Release(SQObject &obj)
{
    SQHash mainpos;
    RefNode *prev;
    RefNode *ref = Get(obj,mainpos,&prev,false);
    if(ref) {
        if(--ref->refs == 0) {
            SQObjectPtr o = ref->obj;
            if(prev) {
                prev->next = ref->next;
            }
            else {
                _buckets[mainpos] = ref->next;
            }
            ref->next = _freelist;
            _freelist = ref;
            _slotused--;
            ref->obj.Null();
            //<<FIXME>>test for shrink?
            return SQTrue;
        }
    }
    else {
        assert(0);
    }
    return SQFalse;
}